

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_widget_layout_states nk_widget(nk_rect *bounds,nk_context *ctx)

{
  float fVar1;
  uint uVar2;
  nk_panel *pnVar3;
  nk_widget_layout_states nVar4;
  nk_widget_layout_states nVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x49e4,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x49e5,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x49e6,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  nk_panel_alloc_space(bounds,ctx);
  pnVar3 = ctx->current->layout;
  uVar2 = pnVar3->flags;
  if (-1 < (short)uVar2) {
    if ((uVar2 >> 0xd & 1) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_HIDDEN)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x49f7,
                    "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                   );
    }
    if ((uVar2 >> 0xe & 1) == 0) {
      fVar8 = (pnVar3->clip).x;
      fVar9 = (pnVar3->clip).y;
      fVar12 = (pnVar3->clip).w;
      fVar13 = (pnVar3->clip).h;
      fVar10 = bounds->w;
      fVar1 = bounds->h;
      fVar6 = (float)(int)bounds->x;
      fVar7 = (float)(int)bounds->y;
      bounds->x = fVar6;
      bounds->y = fVar7;
      bounds->w = (float)(int)fVar10;
      bounds->h = (float)(int)fVar1;
      fVar11 = (float)(int)fVar8;
      fVar8 = (float)(int)fVar12 + fVar11;
      nVar4 = NK_WIDGET_INVALID;
      nVar5 = NK_WIDGET_INVALID;
      if ((fVar6 <= fVar8) && (fVar12 = (float)(int)fVar10 + fVar6, nVar5 = nVar4, fVar11 <= fVar12)
         ) {
        fVar10 = (float)(int)fVar9;
        fVar9 = (float)(int)fVar13 + fVar10;
        if ((fVar7 <= fVar9) && (fVar13 = (float)(int)fVar1 + fVar7, fVar10 <= fVar13)) {
          if (fVar6 <= fVar11) {
            fVar6 = fVar11;
          }
          fVar1 = (ctx->input).mouse.pos.x;
          nVar5 = NK_WIDGET_ROM;
          if (fVar6 <= fVar1) {
            if (fVar12 <= fVar8) {
              fVar8 = fVar12;
            }
            fVar12 = fVar8 - fVar6;
            if (fVar8 - fVar6 <= 0.0) {
              fVar12 = 0.0;
            }
            if (fVar1 < fVar12 + fVar6) {
              if (fVar7 <= fVar10) {
                fVar7 = fVar10;
              }
              if (fVar13 <= fVar9) {
                fVar9 = fVar13;
              }
              fVar9 = fVar9 - fVar7;
              if (fVar9 <= 0.0) {
                fVar9 = 0.0;
              }
              fVar8 = (ctx->input).mouse.pos.y;
              nVar5 = NK_WIDGET_ROM - (fVar8 < fVar9 + fVar7 && fVar7 <= fVar8);
            }
          }
        }
      }
      return nVar5;
    }
    __assert_fail("!(layout->flags & NK_WINDOW_CLOSED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x49f8,
                  "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
                 );
  }
  __assert_fail("!(layout->flags & NK_WINDOW_MINIMIZED)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x49f6,
                "enum nk_widget_layout_states nk_widget(struct nk_rect *, const struct nk_context *)"
               );
}

Assistant:

NK_API enum nk_widget_layout_states
nk_widget(struct nk_rect *bounds, const struct nk_context *ctx)
{
    struct nk_rect c, v;
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return NK_WIDGET_INVALID;

    /* allocate space and check if the widget needs to be updated and drawn */
    nk_panel_alloc_space(bounds, ctx);
    win = ctx->current;
    layout = win->layout;
    in = &ctx->input;
    c = layout->clip;

    /*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
    NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
    NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
    NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

    /* need to convert to int here to remove floating point errors */
    bounds->x = (float)((int)bounds->x);
    bounds->y = (float)((int)bounds->y);
    bounds->w = (float)((int)bounds->w);
    bounds->h = (float)((int)bounds->h);

    c.x = (float)((int)c.x);
    c.y = (float)((int)c.y);
    c.w = (float)((int)c.w);
    c.h = (float)((int)c.h);

    nk_unify(&v, &c, bounds->x, bounds->y, bounds->x + bounds->w, bounds->y + bounds->h);
    if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds->x, bounds->y, bounds->w, bounds->h))
        return NK_WIDGET_INVALID;
    if (!NK_INBOX(in->mouse.pos.x, in->mouse.pos.y, v.x, v.y, v.w, v.h))
        return NK_WIDGET_ROM;
    return NK_WIDGET_VALID;
}